

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ID.cpp
# Opt level: O2

int __thiscall ID_table_t::find_pos(ID_table_t *this,string *id_name)

{
  pointer pIVar1;
  __type _Var2;
  int iVar3;
  pointer pIVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pIVar4 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_start;
  pIVar1 = (this->table).super__Vector_base<ID,_std::allocator<ID>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  iVar3 = 0;
  while( true ) {
    if (pIVar4 == pIVar1) {
      return -1;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)&pIVar4->name);
    _Var2 = std::operator==(id_name,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var2) break;
    iVar3 = iVar3 + 1;
    pIVar4 = pIVar4 + 1;
  }
  return iVar3;
}

Assistant:

int ID_table_t::find_pos(const string id_name) const {
    vector<ID>::const_iterator ptr = table.cbegin();
    vector<ID>::const_iterator end  = table.cend();
    int i = 0;

    while(ptr != end){
        if(id_name == ptr->get_name())
            return i;
        ++ptr;
        ++i;
    }
    return -1;
}